

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void testSelect(void)

{
  pointer *ppNVar1;
  Node *this;
  Node *pNVar2;
  FILE *pFVar3;
  undefined8 uVar4;
  int iVar5;
  ElementData *pEVar6;
  char *in_RCX;
  fd_set *in_R8;
  char *in_R9;
  undefined1 local_558 [32];
  undefined1 local_538 [16];
  undefined1 local_528 [24];
  string source;
  Node mainNode;
  undefined1 local_468 [32];
  Node node;
  stringstream buffer;
  ostream local_3b0 [112];
  ios_base local_340 [264];
  ifstream file;
  streambuf local_228 [504];
  
  std::ifstream::ifstream(&file,"source/parseTest.html",_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&buffer);
  std::ostream::operator<<(local_3b0,local_228);
  std::__cxx11::stringbuf::str();
  crawler::parse(&node,&source);
  ppNVar1 = &mainNode.children.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  mainNode.children.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppNVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&mainNode,"div","");
  crawler::Node::select
            ((Node *)local_558,(int)&node,(fd_set *)&mainNode,(fd_set *)in_RCX,in_R8,
             (timeval *)in_R9);
  this = (Node *)local_558._0_8_;
  pNVar2 = (Node *)local_558._8_8_;
  if (mainNode.children.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)ppNVar1) {
    operator_delete(mainNode.children.
                    super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&((mainNode.children.
                                     super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->children).
                                   super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
    this = (Node *)local_558._0_8_;
    pNVar2 = (Node *)local_558._8_8_;
  }
  for (; uVar4 = local_558._8_8_, this != (Node *)local_558._8_8_; this = this + 1) {
    test_count = test_count + 1;
    local_558._8_8_ = pNVar2;
    pEVar6 = crawler::Node::getElementData(this);
    iVar5 = strcmp((pEVar6->tagName)._M_dataplus._M_p,"div");
    pFVar3 = _stderr;
    if (iVar5 == 0) {
      test_pass = test_pass + 1;
    }
    else {
      crawler::Node::getElementData(this);
      in_RCX = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp";
      in_R8 = (fd_set *)0xd5;
      in_R9 = "strcmp((result.getElementData().getTagName().c_str()), (\"div\")) == 0";
      fprintf(pFVar3,"function %s(): %s:%d  Assertion `%s` failed. expect: %s actual: %s\n",
              "testSelect");
    }
    pNVar2 = (Node *)local_558._8_8_;
    local_558._8_8_ = uVar4;
  }
  local_558._8_8_ = pNVar2;
  mainNode.children.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppNVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&mainNode,"#main","");
  crawler::Node::select
            ((Node *)local_468,(int)&node,(fd_set *)&mainNode,(fd_set *)in_RCX,in_R8,
             (timeval *)in_R9);
  local_528._0_8_ = local_558._16_8_;
  local_538._8_8_ = local_558._8_8_;
  local_538._0_8_ = local_558._0_8_;
  local_558._16_8_ = local_468._16_8_;
  local_558._0_8_ = local_468._0_8_;
  local_558._8_8_ = local_468._8_8_;
  local_468._0_8_ = (pointer)0x0;
  local_468._8_8_ = (pointer)0x0;
  local_468._16_8_ = (pointer)0x0;
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector
            ((vector<crawler::Node,_std::allocator<crawler::Node>_> *)local_538);
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector
            ((vector<crawler::Node,_std::allocator<crawler::Node>_> *)local_468);
  if (mainNode.children.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)ppNVar1) {
    operator_delete(mainNode.children.
                    super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&((mainNode.children.
                                     super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->children).
                                   super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  test_count = test_count + 1;
  if (local_558._8_8_ - local_558._0_8_ == 0x88) {
    test_pass = test_pass + 1;
  }
  else {
    fprintf(_stderr,"function %s(): %s:%d  Assertion `%s` failed. expect: %d actual: %d\n",
            "testSelect",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp"
            ,0xd8,"true == (nodes.size() == 1)",1,0);
  }
  uVar4 = local_558._0_8_;
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::vector
            (&mainNode.children,
             (vector<crawler::Node,_std::allocator<crawler::Node>_> *)local_558._0_8_);
  mainNode.nodeType = *(NodeType *)(uVar4 + 0x18);
  std::__detail::__variant::
  _Copy_ctor_base<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&mainNode.nodeData,
                    (_Copy_ctor_base<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(uVar4 + 0x20));
  mainNode.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (((shared_ptr<crawler::Node> *)(uVar4 + 0x78))->
       super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  mainNode.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (((shared_ptr<crawler::Node> *)(uVar4 + 0x78))->
       super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (mainNode.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mainNode.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mainNode.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mainNode.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mainNode.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  test_count = test_count + 1;
  pEVar6 = crawler::Node::getElementData(&mainNode);
  iVar5 = strcmp((pEVar6->tagName)._M_dataplus._M_p,"div");
  pFVar3 = _stderr;
  if (iVar5 == 0) {
    test_pass = test_pass + 1;
  }
  else {
    pEVar6 = crawler::Node::getElementData(&mainNode);
    fprintf(pFVar3,"function %s(): %s:%d  Assertion `%s` failed. expect: %s actual: %s\n",
            "testSelect",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp"
            ,0xda,"strcmp((mainNode.getElementData().getTagName().c_str()), (\"div\")) == 0",
            (pEVar6->tagName)._M_dataplus._M_p,"div");
  }
  test_count = test_count + 1;
  pEVar6 = crawler::Node::getElementData(&mainNode);
  crawler::ElementData::clazz_abi_cxx11_((string *)local_538,pEVar6);
  uVar4 = local_538._0_8_;
  iVar5 = strcmp((char *)local_538._0_8_,"test");
  if ((Node *)uVar4 != (Node *)local_528) {
    operator_delete((void *)uVar4,(ulong)(local_528._0_8_ + 1));
  }
  if (iVar5 == 0) {
    test_pass = test_pass + 1;
  }
  else {
    pEVar6 = crawler::Node::getElementData(&mainNode);
    crawler::ElementData::clazz_abi_cxx11_((string *)local_538,pEVar6);
    testSelect();
  }
  if (mainNode.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mainNode.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::__detail::__variant::
  _Variant_storage<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&mainNode.nodeData);
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector(&mainNode.children);
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector
            ((vector<crawler::Node,_std::allocator<crawler::Node>_> *)local_558);
  if (node.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (node.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  std::__detail::__variant::
  _Variant_storage<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&node.nodeData);
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector(&node.children);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)source._M_dataplus._M_p != &source.field_2) {
    operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&buffer);
  std::ios_base::~ios_base(local_340);
  std::ifstream::~ifstream(&file);
  return;
}

Assistant:

void testSelect() {
  std::ifstream file("source/parseTest.html");
  std::stringstream buffer;
  buffer << file.rdbuf();
  std::string source = buffer.str();
  crawler::Node node = crawler::parse(source);
  crawler::Nodes nodes = node.select("div");
  for (auto const &result : nodes) {
    ASSERT_CSTRING_EQ(result.getElementData().getTagName().c_str(), "div");
  }
  nodes = node.select("#main");
  ASSERT_TRUE(nodes.size() == 1);
  crawler::Node mainNode = nodes.front();
  ASSERT_CSTRING_EQ(mainNode.getElementData().getTagName().c_str(), "div");
  ASSERT_CSTRING_EQ(mainNode.getElementData().clazz().c_str(), "test");
}